

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxwell_dist.hpp
# Opt level: O3

result_type_conflict1 __thiscall
trng::maxwell_dist<float>::cdf(maxwell_dist<float> *this,result_type_conflict1 x)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar2 = erff((x * 0.70710677) / (this->P).theta_);
  fVar1 = (this->P).theta_;
  fVar3 = expf((-x * x) / ((fVar1 + fVar1) * fVar1));
  return (fVar3 * x * -0.7978846) / fVar1 + fVar2;
}

Assistant:

cdf(result_type x) const {
      return math::erf(x * math::constants<result_type>::one_over_sqrt_2 / P.theta()) -
             math::constants<result_type>::sqrt_2_over_pi * x *
                 math::exp(-x * x / (2 * P.theta() * P.theta())) / (P.theta());
    }